

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alpha_processing.c
# Opt level: O0

void PackRGB_C(uint8_t *r,uint8_t *g,uint8_t *b,int len,int step,uint32_t *out)

{
  uint32_t uVar1;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  long in_R9;
  int offset;
  int i;
  undefined4 local_30;
  undefined4 local_2c;
  
  local_30 = 0;
  for (local_2c = 0; local_2c < in_ECX; local_2c = local_2c + 1) {
    uVar1 = MakeARGB32(0xff,(uint)*(byte *)(in_RDI + local_30),(uint)*(byte *)(in_RSI + local_30),
                       (uint)*(byte *)(in_RDX + local_30));
    *(uint32_t *)(in_R9 + (long)local_2c * 4) = uVar1;
    local_30 = in_R8D + local_30;
  }
  return;
}

Assistant:

static void PackRGB_C(const uint8_t* WEBP_RESTRICT r,
                      const uint8_t* WEBP_RESTRICT g,
                      const uint8_t* WEBP_RESTRICT b,
                      int len, int step, uint32_t* WEBP_RESTRICT out) {
  int i, offset = 0;
  for (i = 0; i < len; ++i) {
    out[i] = MakeARGB32(0xff, r[offset], g[offset], b[offset]);
    offset += step;
  }
}